

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

int Au_NtkCreateFan(Au_Ntk_t *pNtk,int iFanin,int iFanout,int iModel)

{
  uint uVar1;
  ulong *puVar2;
  
  uVar1 = Au_NtkAllocObj(pNtk,1,4);
  puVar2 = (ulong *)((ulong)((uVar1 & 0xfff) << 4) + (long)(pNtk->vPages).pArray[(int)uVar1 >> 0xc])
  ;
  if (iFanin != 0) {
    if ((iFanin < 0) || ((int)puVar2[1] != 0)) goto LAB_0085b8b7;
    *(int *)(puVar2 + 1) = iFanin;
  }
  if ((-1 < iFanout) && (*(int *)((long)puVar2 + 0xc) == 0)) {
    *(int *)((long)puVar2 + 0xc) = iFanout;
    *puVar2 = *puVar2 & 0xffffffffc0000000 | (ulong)(iModel & 0x3fffffff);
    return uVar1;
  }
LAB_0085b8b7:
  __assert_fail("f >= 0 && p->Fanins[i] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                ,0xb3,"void Au_ObjSetFaninLit(Au_Obj_t *, int, int)");
}

Assistant:

int Au_NtkCreateFan( Au_Ntk_t * pNtk, int iFanin, int iFanout, int iModel )
{
    int Id = Au_NtkAllocObj( pNtk, 1, AU_OBJ_FAN );
    Au_Obj_t * p = Au_NtkObj( pNtk, Id );
    if ( iFanin )
        Au_ObjSetFaninLit( p, 0, iFanin );
    Au_ObjSetFaninLit( p, 1, iFanout );
    p->Func = iModel;
    return Id;
}